

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModSqrt_test.cpp
# Opt level: O2

void __thiscall MOD_SQRT_SmallValues_Test::TestBody(MOD_SQRT_SmallValues_Test *this)

{
  int iVar1;
  int extraout_EAX;
  char *message;
  int iVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> primes;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> sqrtable;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  int local_40 [2];
  AssertionResult gtest_ar;
  
  eratosthenes_sieve((vector<int,_std::allocator<int>_> *)local_b0,300);
  while (local_b0 !=
         (undefined1  [8])
         primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start) {
    iVar1 = *(int *)&((__node_base_ptr)local_b0)->_M_nxt;
    primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&sqrtable._M_h._M_rehash_policy._M_next_resize;
    sqrtable._M_h._M_buckets = (__buckets_ptr)0x1;
    uVar5 = 0;
    uVar6 = 0;
    sqrtable._M_h._M_bucket_count = 0;
    sqrtable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    sqrtable._M_h._M_element_count._0_4_ = 0x3f800000;
    sqrtable._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    sqrtable._M_h._M_rehash_policy._4_4_ = 0;
    sqrtable._M_h._M_rehash_policy._M_next_resize = 0;
    iVar4 = 0;
    iVar2 = 0;
    sqrtable._M_h._M_single_bucket = (__node_base_ptr)local_b0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    for (; puVar3 = (undefined8 *)sqrtable._M_h._M_bucket_count, iVar2 != iVar4; iVar4 = iVar4 + 1)
    {
      local_40[0] = iVar4 * iVar4;
      std::__detail::
      _Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,local_40);
      uVar5 = extraout_XMM0_Da;
      uVar6 = extraout_XMM0_Db;
    }
    for (; puVar3 != (undefined8 *)0x0; puVar3 = (undefined8 *)*puVar3) {
      iVar2 = *(int *)(puVar3 + 1);
      sqrt((double)CONCAT44(uVar6,uVar5));
      local_50.ptr_._0_4_ =
           (undefined4)((long)(ulong)(uint)(extraout_EAX * extraout_EAX) % (long)iVar1);
      local_48.data_._0_4_ = iVar2 % iVar1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_40,"(s*s)%p","a % p",(int *)&local_50,(int *)&local_48);
      if (local_40[0]._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        message = "";
        if (gtest_ar._0_8_ != 0) {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/kactl/number-theory/ModSqrt_test.cpp"
                   ,0xc,message);
        testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_48);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_50);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      uVar5 = extraout_XMM0_Da_00;
      uVar6 = extraout_XMM0_Db_00;
    }
    std::
    _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    local_b0 = (undefined1  [8])((long)&(sqrtable._M_h._M_single_bucket)->_M_nxt + 4);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_b0);
  return;
}

Assistant:

TEST(MOD_SQRT, SmallValues) {
    auto primes = eratosthenes_sieve(300);
    for(int p : primes) {
        unordered_set<int> sqrtable;
        rep(a,0,p) sqrtable.insert(a*a);
        for(int a : sqrtable) {
            int s = sqrt(a, p);
            EXPECT_EQ((s*s)%p, a % p);
        }
    }
}